

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.cpp
# Opt level: O0

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::SuiteTest::result(SuiteTest *this)

{
  bool bVar1;
  long in_RSI;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  local_b8;
  shared_ptr<const_oout::Test> local_a0;
  shared_ptr<const_oout::Test> local_90;
  TimedTest local_80;
  undefined1 local_68 [8];
  value_type local_60;
  reference local_50;
  shared_ptr<const_oout::Test> *c;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  *__range1;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  results;
  SuiteTest *this_local;
  
  std::__cxx11::
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>::
  list((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
        *)&__range1);
  __end1 = std::__cxx11::
           list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
           ::begin((list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
                    *)(in_RSI + 8));
  c = (shared_ptr<const_oout::Test> *)
      std::__cxx11::
      list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::
      end((list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
           *)(in_RSI + 8));
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&c);
    if (!bVar1) break;
    local_50 = std::_List_const_iterator<std::shared_ptr<const_oout::Test>_>::operator*(&__end1);
    std::make_shared<oout::SafeTest,std::shared_ptr<oout::Test_const>const&>(&local_a0);
    std::shared_ptr<oout::Test_const>::shared_ptr<oout::SafeTest,void>
              ((shared_ptr<oout::Test_const> *)&local_90,(shared_ptr<oout::SafeTest> *)&local_a0);
    TimedTest::TimedTest(&local_80,&local_90);
    TimedTest::result((TimedTest *)local_68);
    std::shared_ptr<oout::Result_const>::
    shared_ptr<oout::Result_const,std::default_delete<oout::Result_const>,void>
              ((shared_ptr<oout::Result_const> *)&local_60,
               (unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> *)local_68)
    ;
    std::__cxx11::
    list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
    ::push_back((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
                 *)&__range1,&local_60);
    std::shared_ptr<const_oout::Result>::~shared_ptr(&local_60);
    std::unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_>::~unique_ptr
              ((unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> *)local_68)
    ;
    TimedTest::~TimedTest(&local_80);
    std::shared_ptr<const_oout::Test>::~shared_ptr(&local_90);
    std::shared_ptr<oout::SafeTest>::~shared_ptr((shared_ptr<oout::SafeTest> *)&local_a0);
    std::_List_const_iterator<std::shared_ptr<const_oout::Test>_>::operator++(&__end1);
  }
  std::
  make_unique<oout::SuiteResult,std::__cxx11::list<std::shared_ptr<oout::Result_const>,std::allocator<std::shared_ptr<oout::Result_const>>>&>
            (&local_b8);
  std::unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>>::
  unique_ptr<oout::SuiteResult,std::default_delete<oout::SuiteResult>,void>
            ((unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>> *)this,
             (unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)&local_b8);
  std::unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_>::~unique_ptr
            ((unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)&local_b8);
  std::__cxx11::
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>::
  ~list((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
         *)&__range1);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> SuiteTest::result() const
{
	list<shared_ptr<const Result>> results;
	for (const auto &c : cases) {
		results.push_back(TimedTest(make_shared<SafeTest>(c)).result());
	}
	return make_unique<SuiteResult>(results);
}